

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O1

void __thiscall
helics::MessageFederate::MessageFederate
          (MessageFederate *this,string_view fedName,string *configString)

{
  FederateInfo local_1d0;
  
  loadFederateInfo(&local_1d0,(string *)configString);
  Federate::Federate((Federate *)&this->field_0x10,fedName,&local_1d0);
  FederateInfo::~FederateInfo(&local_1d0);
  this->_vptr_MessageFederate = (_func_int **)0x551c78;
  *(undefined8 *)&this->field_0x10 = 0x551d40;
  (this->mfManager)._M_t.
  super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
  .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl =
       (MessageFederateManager *)0x0;
  loadFederateData(this);
  return;
}

Assistant:

MessageFederate::MessageFederate(std::string_view fedName, const std::string& configString):
    Federate(fedName, loadFederateInfo(configString))
{
    loadFederateData();
}